

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printbuf.c
# Opt level: O0

int printbuf_memset(printbuf *pb,int offset,int charvalue,int len)

{
  int min_size;
  int iVar1;
  int *piVar2;
  int size_needed;
  int len_local;
  int charvalue_local;
  int offset_local;
  printbuf *pb_local;
  
  len_local = offset;
  if (offset == -1) {
    len_local = pb->bpos;
  }
  if (((len < 0) || (len_local < -1)) || (0x7fffffff - len_local < len)) {
    piVar2 = __errno_location();
    *piVar2 = 0x1b;
    pb_local._4_4_ = -1;
  }
  else {
    min_size = len_local + len;
    if ((pb->size < min_size) && (iVar1 = printbuf_extend(pb,min_size), iVar1 < 0)) {
      pb_local._4_4_ = -1;
    }
    else {
      if (pb->bpos < len_local) {
        memset(pb->buf + pb->bpos,0,(long)(len_local - pb->bpos));
      }
      memset(pb->buf + len_local,charvalue & 0xff,(long)len);
      if (pb->bpos < min_size) {
        pb->bpos = min_size;
      }
      pb_local._4_4_ = 0;
    }
  }
  return pb_local._4_4_;
}

Assistant:

int printbuf_memset(struct printbuf *pb, int offset, int charvalue, int len)
{
	int size_needed;

	if (offset == -1)
		offset = pb->bpos;
	/* Prevent signed integer overflows with large buffers. */
	if (len < 0 || offset < -1 || len > INT_MAX - offset)
	{
		errno = EFBIG;
		return -1;
	}
	size_needed = offset + len;
	if (pb->size < size_needed)
	{
		if (printbuf_extend(pb, size_needed) < 0)
			return -1;
	}

	if (pb->bpos < offset)
		memset(pb->buf + pb->bpos, '\0', offset - pb->bpos);
	memset(pb->buf + offset, charvalue, len);
	if (pb->bpos < size_needed)
		pb->bpos = size_needed;

	return 0;
}